

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,void *dirtyPage,HeapBlockType blockType,L2MapChunk *chunk,uint id2,
          bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BVStatic<256UL> *this_00;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *block;
  
  if (chunk == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2c8,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar3) goto LAB_0062e89d;
    *puVar4 = 0;
  }
  this_00 = L2MapChunk::GetMarkBitVectorForPages<256ul>
                      (chunk,(char *)((ulong)dirtyPage & 0xfffffffffffff000));
  bVar3 = BVStatic<256UL>::IsAllClear(this_00);
  if (!bVar3) {
    block = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)chunk->map[id2];
    if ((block->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
        super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.heapBlockType !=
        blockType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x2d2,"(chunk->map[id2]->GetHeapBlockType() == blockType)",
                         "chunk->map[id2]->GetHeapBlockType() == blockType");
      if (!bVar3) {
LAB_0062e89d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      block = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)chunk->map[id2];
    }
    bVar1 = chunk->blockInfo[id2].bucketIndex;
    bVar3 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
            ::RescanObjectsOnPage
                      (block,(char *)dirtyPage,(char *)((ulong)dirtyPage & 0xfffffffffffff000),
                       this_00,(uint)bVar1 * 0x10 + 0x10,(uint)bVar1,anyObjectsMarkedOnPage,recycler
                      );
    if (bVar3) {
      return true;
    }
    HeapBlock::SetNeedOOMRescan(chunk->map[id2],recycler);
  }
  return false;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlock(void * dirtyPage, HeapBlock::HeapBlockType blockType, L2MapChunk* chunk, uint id2, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    Assert(chunk != nullptr);
    char* heapBlockPageAddress = TBlockType::GetBlockStartAddress((char*) dirtyPage);

    typedef typename TBlockType::HeapBlockAttributes TBlockAttributes;

    // We need to check the entire mark bit vector here. It's not sufficient to just check the page's
    // mark bit vector because the object that's dirty on the page could have started on an earlier page
    auto markBits = chunk->GetMarkBitVectorForPages<TBlockAttributes::BitVectorCount>(heapBlockPageAddress);
    if (!markBits->IsAllClear())
    {
        Assert(chunk->map[id2]->GetHeapBlockType() == blockType);

        // Small finalizable heap blocks require the HeapBlock * (to look up object attributes).
        // For others, this is null
        TBlockType* block = GetHeapBlockForRescan<TBlockType>(chunk, id2);
        uint bucketIndex = chunk->blockInfo[id2].bucketIndex;
        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(block,
            (char *)dirtyPage, heapBlockPageAddress, markBits, HeapInfo::GetObjectSizeForBucketIndex<TBlockAttributes>(bucketIndex), bucketIndex, anyObjectsMarkedOnPage, recycler))
        {
            // Failed due to OOM
            ((TBlockType*) chunk->map[id2])->SetNeedOOMRescan(recycler);
            return false;
        }

        return true;
    }

    // Didn't actually rescan the block.
    return false;
}